

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  bool bVar1;
  BuiltIn builtin;
  StorageClass SVar2;
  StorageClass SVar3;
  int iVar4;
  SPIRType *pSVar5;
  SPIRVariable *pSVar6;
  SPIRConstant *c;
  uint local_78;
  uint32_t local_74;
  string local_70;
  string local_50;
  
  pSVar5 = Compiler::expression_type((Compiler *)this,id_lhs);
  pSVar5 = Compiler::get_pointee_type((Compiler *)this,pSVar5);
  bVar1 = Compiler::is_array((Compiler *)this,pSVar5);
  if (!bVar1) {
    return false;
  }
  pSVar6 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id_lhs);
  if (((pSVar6 != (SPIRVariable *)0x0) && (pSVar6->remapped_variable == true)) &&
     (pSVar6->statically_assigned != false)) {
    return true;
  }
  if (((pSVar6 == (SPIRVariable *)0x0) ||
      ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
       [id_rhs].type != TypeConstant)) || (pSVar6->deferred_declaration != true)) {
    bVar1 = is_tesc_shader(this);
    if (((!bVar1) || (bVar1 = Compiler::has_decoration((Compiler *)this,(ID)id_lhs,BuiltIn), !bVar1)
        ) || (builtin = Compiler::get_decoration((Compiler *)this,(ID)id_lhs,BuiltIn),
             builtin - BuiltInTessCoord < 0xfffffffe)) {
      SVar2 = CompilerGLSL::get_expression_effective_storage_class(&this->super_CompilerGLSL,id_lhs)
      ;
      SVar3 = CompilerGLSL::get_expression_effective_storage_class(&this->super_CompilerGLSL,id_rhs)
      ;
      iVar4 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x38])
                        (this,0,(ulong)id_lhs,(ulong)id_rhs,(ulong)SVar2,(ulong)SVar3);
      if ((char)iVar4 != '\0') {
        Compiler::register_write((Compiler *)this,id_lhs);
        return true;
      }
      return false;
    }
    local_74 = get_physical_tess_level_array_size(this,builtin);
    if (local_74 != 1) {
      for (local_78 = 0; local_78 < local_74; local_78 = local_78 + 1) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
        CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id_rhs,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[10],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                  (&this->super_CompilerGLSL,&local_50,(char (*) [2])0x330702,&local_78,
                   (char (*) [10])"] = half(",&local_70,(char (*) [2])0x330702,&local_78,
                   (char (*) [4])0x32f282);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      return true;
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
    CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id_rhs,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[6]>
              (&this->super_CompilerGLSL,&local_50,(char (*) [9])0x341218,&local_70,
               (char (*) [6])0x32f280);
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,id_lhs,true);
    c = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,id_rhs);
    CompilerGLSL::constant_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,c,false,false);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_50,(char (*) [4])0x34513c,&local_70,
               (char (*) [2])0x344fd0);
  }
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_lhs);
	if (!is_array(get_pointee_type(type)))
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	if (is_tesc_shader() && has_decoration(id_lhs, DecorationBuiltIn))
	{
		auto builtin = BuiltIn(get_decoration(id_lhs, DecorationBuiltIn));
		// Need to manually unroll the array store.
		if (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter)
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			if (array_size == 1)
				statement(to_expression(id_lhs), " = half(", to_expression(id_rhs), "[0]);");
			else
			{
				for (uint32_t i = 0; i < array_size; i++)
					statement(to_expression(id_lhs), "[", i, "] = half(", to_expression(id_rhs), "[", i, "]);");
			}
			return true;
		}
	}

	auto lhs_storage = get_expression_effective_storage_class(id_lhs);
	auto rhs_storage = get_expression_effective_storage_class(id_rhs);
	if (!emit_array_copy(nullptr, id_lhs, id_rhs, lhs_storage, rhs_storage))
		return false;

	register_write(id_lhs);

	return true;
}